

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O2

void __thiscall adios2::transport::FileStdio::Truncate(FileStdio *this,size_t length)

{
  int iVar1;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  WaitForOpen(this);
  iVar1 = fileno((FILE *)this->m_File);
  iVar1 = ftruncate(iVar1,length);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_f1);
    std::__cxx11::string::string((string *)&local_50,"transport::file::FileStdio",&local_f2);
    std::__cxx11::string::string((string *)&local_70,"Truncate",&local_f3);
    std::__cxx11::to_string(&local_f0,length);
    std::operator+(&local_d0,"couldn\'t truncate to ",&local_f0);
    std::operator+(&local_b0,&local_d0," of file ");
    std::operator+(&local_90,&local_b0,&(this->super_Transport).m_Name);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void FileStdio::Truncate(const size_t length)
{

    WaitForOpen();
    int fd = fileno(m_File);
    const auto status = ftruncate(fd, length);
    if (status == -1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Truncate",
                                              "couldn't truncate to " + std::to_string(length) +
                                                  " of file " + m_Name);
    }
}